

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

ConstSchema __thiscall capnp::Schema::asConst(Schema *this)

{
  Schema SVar1;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if ((local_40._reader.dataSize < 0x70) || (*(short *)((long)local_40._reader.data + 0xc) != 4)) {
    getProto(&local_40,this);
    local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x125,FAILED,"getProto().isConst()",
               "\"Tried to use non-constant schema as a constant.\", getProto().getDisplayName()",
               (char (*) [48])"Tried to use non-constant schema as a constant.",(Reader *)&local_50)
    ;
    kj::_::Debug::Fault::~Fault(&f);
    SVar1.raw = (RawBrandedSchema *)(_::NULL_CONST_SCHEMA + 0x48);
  }
  else {
    SVar1 = (Schema)this->raw;
  }
  return (ConstSchema)SVar1.raw;
}

Assistant:

ConstSchema Schema::asConst() const {
  KJ_REQUIRE(getProto().isConst(), "Tried to use non-constant schema as a constant.",
             getProto().getDisplayName()) {
    return ConstSchema();
  }
  return ConstSchema(*this);
}